

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O3

Expression * __thiscall
wasm::SExpressionWasmBuilder::makeCallRef(SExpressionWasmBuilder *this,Element *s,bool isReturn)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_t sVar4;
  size_t sVar5;
  bool bVar6;
  Element *pEVar7;
  List *pLVar8;
  Expression *target;
  CallRef *pCVar9;
  string *psVar10;
  long *plVar11;
  long *plVar12;
  long *plVar13;
  char *pcVar14;
  char *pcVar15;
  Signature SVar16;
  long local_88;
  long lStack_80;
  Builder local_78 [2];
  pointer puStack_58;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> operands;
  HeapType local_38;
  HeapType sigType;
  
  pEVar7 = Element::operator[](s,1);
  local_38 = parseHeapType(this,pEVar7);
  puStack_58 = (pointer)0x0;
  operands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  operands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pLVar8 = Element::list(s);
  parseOperands<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            (this,s,2,(int)(pLVar8->
                           super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).
                           usedElements - 1,
             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
             &stack0xffffffffffffffa8);
  pLVar8 = Element::list(s);
  pEVar7 = Element::operator[](s,(int)(pLVar8->
                                      super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>
                                      ).usedElements - 1);
  target = parseExpression(this,pEVar7);
  bVar6 = HeapType::isSignature(&stack0xffffffffffffffc8);
  if (bVar6) {
    local_78[0].wasm = this->wasm;
    SVar16 = HeapType::getSignature(&stack0xffffffffffffffc8);
    pCVar9 = Builder::makeCallRef<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                       (local_78,target,
                        (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                        &stack0xffffffffffffffa8,SVar16.results.id,isReturn);
    if (puStack_58 != (pointer)0x0) {
      operator_delete(puStack_58,
                      (long)operands.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puStack_58);
    }
    return (Expression *)pCVar9;
  }
  pcVar15 = "call_ref";
  if (isReturn) {
    pcVar15 = "return_call_ref";
  }
  pcVar14 = pcVar15 + 8;
  if (isReturn) {
    pcVar14 = pcVar15 + 0xf;
  }
  psVar10 = (string *)__cxa_allocate_exception(0x30);
  local_78[0].wasm = (Module *)&stack0xffffffffffffff98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,pcVar15,pcVar14);
  plVar11 = (long *)std::__cxx11::string::append((char *)local_78);
  plVar13 = (long *)*plVar11;
  plVar12 = plVar11 + 2;
  if (plVar13 == plVar12) {
    local_88 = *plVar12;
    lStack_80 = plVar11[3];
    plVar13 = &local_88;
  }
  else {
    local_88 = *plVar12;
  }
  lVar1 = plVar11[1];
  *plVar11 = (long)plVar12;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  sVar4 = s->line;
  uVar2 = *(undefined4 *)((long)&s->line + 4);
  sVar5 = s->col;
  uVar3 = *(undefined4 *)((long)&s->col + 4);
  *(string **)psVar10 = psVar10 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar10,plVar13,lVar1 + (long)plVar13);
  *(int *)(psVar10 + 0x20) = (int)sVar4;
  *(undefined4 *)(psVar10 + 0x24) = uVar2;
  *(int *)(psVar10 + 0x28) = (int)sVar5;
  *(undefined4 *)(psVar10 + 0x2c) = uVar3;
  __cxa_throw(psVar10,&ParseException::typeinfo,ParseException::~ParseException);
}

Assistant:

Expression* SExpressionWasmBuilder::makeCallRef(Element& s, bool isReturn) {
  HeapType sigType = parseHeapType(*s[1]);
  std::vector<Expression*> operands;
  parseOperands(s, 2, s.size() - 1, operands);
  auto* target = parseExpression(s[s.size() - 1]);

  if (!sigType.isSignature()) {
    throw ParseException(
      std::string(isReturn ? "return_call_ref" : "call_ref") +
        " type annotation should be a signature",
      s.line,
      s.col);
  }
  return Builder(wasm).makeCallRef(
    target, operands, sigType.getSignature().results, isReturn);
}